

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_134::checkEnumList<capnp::DynamicValue::Reader>
          (anon_unknown_134 *this,Reader *reader,initializer_list<const_char_*> expected)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  const_iterator ppcVar4;
  ReaderFor<capnp::DynamicEnum> RVar5;
  ArrayPtr<const_char> AVar6;
  DynamicEnum e;
  DynamicEnum e_00;
  Reader local_1e8;
  Schema local_1a0;
  uint local_198;
  ArrayPtr<const_char> local_190;
  bool local_179;
  Schema SStack_178;
  bool _kj_shouldLog;
  uint16_t local_170;
  Reader local_168;
  Schema local_120;
  uint local_118;
  ArrayPtr<const_char> local_110;
  char **local_100;
  undefined1 local_f8 [8];
  DebugComparison<const_char_*const_&,_capnp::Text::Reader> _kjCondition_1;
  uint i;
  uint local_b4;
  size_type local_b0;
  Fault local_a8;
  Fault f;
  size_type local_98;
  DebugExpression<unsigned_long> local_90;
  undefined1 local_88 [8];
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  ReaderFor<capnp::DynamicList> list;
  Reader *reader_local;
  initializer_list<const_char_*> expected_local;
  
  expected_local._M_array = expected._M_array;
  reader_local = reader;
  DynamicValue::Reader::as<capnp::DynamicList>
            ((ReaderFor<capnp::DynamicList> *)&_kjCondition.result,(Reader *)this);
  local_98 = std::initializer_list<const_char_*>::size
                       ((initializer_list<const_char_*> *)&reader_local);
  local_90 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_98);
  f.exception._4_4_ = DynamicList::Reader::size((Reader *)&_kjCondition.result);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_int> *)local_88,&local_90,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
  if (bVar1) {
    _kjCondition_1.result = false;
    _kjCondition_1._41_3_ = 0;
    while( true ) {
      uVar2 = (ulong)(uint)_kjCondition_1._40_4_;
      sVar3 = std::initializer_list<const_char_*>::size
                        ((initializer_list<const_char_*> *)&reader_local);
      if (sVar3 <= uVar2) break;
      ppcVar4 = std::initializer_list<const_char_*>::begin
                          ((initializer_list<const_char_*> *)&reader_local);
      local_100 = (char **)kj::_::DebugExpressionStart::operator<<
                                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                      ppcVar4 + (uint)_kjCondition_1._40_4_);
      DynamicList::Reader::operator[]
                (&local_168,(Reader *)&_kjCondition.result,_kjCondition_1._40_4_);
      RVar5 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_168);
      e._8_8_ = RVar5._8_8_;
      SStack_178.raw = (RawBrandedSchema *)RVar5.schema.super_Schema.raw;
      local_170 = RVar5.value;
      local_118 = CONCAT22(local_118._2_2_,local_170);
      e.schema.super_Schema.raw._4_4_ = 0;
      e.schema.super_Schema.raw._0_4_ = local_118;
      local_120.raw = SStack_178.raw;
      AVar6 = (ArrayPtr<const_char>)name((anon_unknown_134 *)SStack_178.raw,e);
      local_110 = AVar6;
      kj::_::DebugExpression<char_const*const&>::operator==
                ((DebugComparison<const_char_*const_&,_capnp::Text::Reader> *)local_f8,
                 (DebugExpression<char_const*const&> *)&local_100,(Reader *)&local_110);
      DynamicValue::Reader::~Reader(&local_168);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
      if (!bVar1) {
        local_179 = kj::_::Debug::shouldLog(ERROR);
        while (local_179 != false) {
          ppcVar4 = std::initializer_list<const_char_*>::begin
                              ((initializer_list<const_char_*> *)&reader_local);
          uVar2 = (ulong)(uint)_kjCondition_1._40_4_;
          DynamicList::Reader::operator[]
                    (&local_1e8,(Reader *)&_kjCondition.result,_kjCondition_1._40_4_);
          RVar5 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_1e8);
          e_00._8_8_ = RVar5._8_8_;
          local_1a0.raw = (RawBrandedSchema *)RVar5.schema.super_Schema.raw;
          local_198 = CONCAT22(local_198._2_2_,RVar5.value);
          e_00.schema.super_Schema.raw._4_4_ = 0;
          e_00.schema.super_Schema.raw._0_4_ = local_198;
          AVar6 = (ArrayPtr<const_char>)name((anon_unknown_134 *)local_1a0.raw,e_00);
          local_190 = AVar6;
          kj::_::Debug::
          log<char_const(&)[85],kj::_::DebugComparison<char_const*const&,capnp::Text::Reader>&,char_const*const&,capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x152,ERROR,
                     "\"failed: expected \" \"(expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))\", _kjCondition, expected.begin()[i], name(list[i].template as<DynamicEnum>())"
                     ,(char (*) [85])
                      "failed: expected (expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))"
                     ,(DebugComparison<const_char_*const_&,_capnp::Text::Reader> *)local_f8,
                     ppcVar4 + uVar2,(Reader *)&local_190);
          DynamicValue::Reader::~Reader(&local_1e8);
          local_179 = false;
        }
      }
      _kjCondition_1._40_4_ = _kjCondition_1._40_4_ + 1;
    }
    return;
  }
  local_b0 = std::initializer_list<const_char_*>::size
                       ((initializer_list<const_char_*> *)&reader_local);
  local_b4 = DynamicList::Reader::size((Reader *)&_kjCondition.result);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x150,FAILED,"(expected.size()) == (list.size())",
             "_kjCondition,expected.size(), list.size()",
             (DebugComparison<unsigned_long,_unsigned_int> *)local_88,&local_b0,&local_b4);
  kj::_::Debug::Fault::fatal(&local_a8);
}

Assistant:

void checkEnumList(T reader, std::initializer_list<const char*> expected) {
  auto list = reader.as<DynamicList>();
  ASSERT_EQ(expected.size(), list.size());
  for (uint i = 0; i < expected.size(); i++) {
    EXPECT_EQ(expected.begin()[i], name(list[i].as<DynamicEnum>()));
  }
}